

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

void __thiscall BackupRestaurant::act(BackupRestaurant *this,Restaurant *restaurant)

{
  Restaurant *pRVar1;
  Restaurant *restaurant_local;
  BackupRestaurant *this_local;
  
  BaseAction::complete(&this->super_BaseAction);
  if (backup == (Restaurant *)0x0) {
    pRVar1 = (Restaurant *)operator_new(0x78);
    Restaurant::Restaurant(pRVar1,restaurant);
    backup = pRVar1;
  }
  else {
    if (backup != (Restaurant *)0x0) {
      (*backup->_vptr_Restaurant[1])();
    }
    backup = (Restaurant *)0x0;
    pRVar1 = (Restaurant *)operator_new(0x78);
    Restaurant::Restaurant(pRVar1,restaurant);
    backup = pRVar1;
  }
  return;
}

Assistant:

void BackupRestaurant::act(Restaurant &restaurant)
{
    complete();
    if(backup!= nullptr)
    {
        delete backup;
        backup= nullptr;
        backup =  new Restaurant(restaurant);
    }
    else
        backup = new Restaurant(restaurant);
}